

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

BoxList * __thiscall amrex::BoxArray::boxList(BoxList *__return_storage_ptr__,BoxArray *this)

{
  pointer *ppBVar1;
  long *plVar2;
  BATType BVar3;
  element_type *peVar4;
  iterator iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  Box *__args;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  IntVect IVar21;
  Box result;
  Box bx;
  undefined8 local_a8;
  uint uStack_a0;
  uint auStack_9c [2];
  undefined8 uStack_94;
  element_type *local_80;
  Box local_78;
  ulong local_58;
  int local_4c [3];
  int local_40 [3];
  
  peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar18 = ((long)*(pointer *)
                   ((long)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data + 8) -
            *(long *)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7;
  BoxList::BoxList(__return_storage_ptr__);
  uVar16 = (uint)lVar18;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::reserve
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__return_storage_ptr__,
             (long)(int)uVar16);
  if ((int)uVar16 < 1) {
    return __return_storage_ptr__;
  }
  BVar3 = (this->m_bat).m_bat_type;
  switch(BVar3) {
  case null:
  case coarsenRatio:
    (__return_storage_ptr__->btype).itype = 0;
    local_80 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (BVar3 == null) {
      uVar19 = (ulong)(uVar16 & 0x7fffffff);
      lVar18 = 0;
      do {
        __args = (Box *)(*(long *)&(local_80->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + lVar18);
        iVar5._M_current =
             (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)__return_storage_ptr__,iVar5,
                     __args);
        }
        else {
          uVar6 = *(undefined8 *)(__args->smallend).vect;
          uVar7 = *(undefined8 *)((__args->smallend).vect + 2);
          uVar8 = *(undefined8 *)((__args->bigend).vect + 2);
          *(undefined8 *)((iVar5._M_current)->bigend).vect = *(undefined8 *)(__args->bigend).vect;
          *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = uVar8;
          *(undefined8 *)((iVar5._M_current)->smallend).vect = uVar6;
          *(undefined8 *)(((iVar5._M_current)->smallend).vect + 2) = uVar7;
          ppBVar1 = &(__return_storage_ptr__->m_lbox).
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        lVar18 = lVar18 + 0x1c;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
      return __return_storage_ptr__;
    }
    break;
  case indexType:
  case indexType_coarsenRatio:
    (__return_storage_ptr__->btype).itype = (this->m_bat).m_op.m_indexType.m_typ.itype;
    local_80 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    break;
  default:
    (__return_storage_ptr__->btype).itype = (this->m_bat).m_op.m_bndryReg.m_typ.itype;
    local_80 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (BVar3 == bndryReg) {
      uVar19 = (ulong)(uVar16 & 0x7fffffff);
      lVar18 = 0;
      do {
        BATbndryReg::operator()
                  (&local_78,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(local_80->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar18));
        iVar5._M_current =
             (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)__return_storage_ptr__,iVar5,
                     &local_78);
        }
        else {
          *(ulong *)((iVar5._M_current)->bigend).vect =
               CONCAT44(local_78.bigend.vect[1],local_78.bigend.vect[0]);
          *(ulong *)(((iVar5._M_current)->bigend).vect + 2) =
               CONCAT44(local_78.btype.itype,local_78.bigend.vect[2]);
          *(undefined8 *)((iVar5._M_current)->smallend).vect = local_78.smallend.vect._0_8_;
          *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
               CONCAT44(local_78.bigend.vect[0],local_78.smallend.vect[2]);
          ppBVar1 = &(__return_storage_ptr__->m_lbox).
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        lVar18 = lVar18 + 0x1c;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
      return __return_storage_ptr__;
    }
  }
  if (BVar3 != indexType_coarsenRatio) {
    if (BVar3 == coarsenRatio) {
      uVar16 = 0;
      goto LAB_00457893;
    }
    if (BVar3 != indexType) {
      uVar16 = *(uint *)((long)&(this->m_bat).m_op + 4);
      goto LAB_00457893;
    }
  }
  uVar16 = *(uint *)&(this->m_bat).m_op;
LAB_00457893:
  local_58 = lVar18;
  IVar21 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar13 = IVar21.vect[2];
  local_40[0] = IVar21.vect[0];
  local_40[1] = IVar21.vect[1];
  local_40[2] = IVar21.vect[2];
  iVar17 = IVar21.vect[0];
  local_58 = (ulong)((uint)local_58 & 0x7fffffff);
  uVar19 = 0;
  do {
    lVar18 = *(long *)&(local_80->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data;
    plVar2 = (long *)(lVar18 + uVar19 * 0x1c);
    lVar15 = *plVar2;
    lVar9 = plVar2[1];
    plVar2 = (long *)(lVar18 + 0xc + uVar19 * 0x1c);
    lVar18 = *plVar2;
    lVar10 = plVar2[1];
    auStack_9c[1] = (uint)((ulong)lVar18 >> 0x20);
    uStack_94 = lVar10;
    uStack_a0 = (uint)lVar9;
    auStack_9c[0] = (uint)((ulong)lVar9 >> 0x20);
    iVar20 = IVar21.vect[1];
    local_a8._4_4_ = (uint)((ulong)lVar15 >> 0x20);
    uVar12 = local_a8._4_4_;
    if (IVar21.vect._0_8_ >> 0x20 == 1 && iVar17 == 1) {
      local_a8 = lVar15;
      if (iVar13 != 1) goto LAB_004579a0;
    }
    else {
      local_a8._0_4_ = (uint)lVar15;
      if (iVar17 != 1) {
        if (iVar17 == 4) {
          if ((int)(uint)local_a8 < 0) {
            local_a8._0_4_ = (int)(uint)local_a8 >> 2;
          }
          else {
            local_a8._0_4_ = (uint)local_a8 >> 2;
          }
        }
        else if (iVar17 == 2) {
          if ((int)(uint)local_a8 < 0) {
            local_a8._0_4_ = (int)(uint)local_a8 >> 1;
          }
          else {
            local_a8._0_4_ = (uint)local_a8 >> 1;
          }
        }
        else if ((int)(uint)local_a8 < 0) {
          local_a8._0_4_ = ~((int)~(uint)local_a8 / iVar17);
        }
        else {
          local_a8._0_4_ = (int)(uint)local_a8 / iVar17;
        }
      }
      if (iVar20 != 1) {
        if (iVar20 == 4) {
          if (lVar15 < 0) {
            uVar12 = (int)local_a8._4_4_ >> 2;
          }
          else {
            uVar12 = local_a8._4_4_ >> 2;
          }
        }
        else if (iVar20 == 2) {
          if (lVar15 < 0) {
            uVar12 = (int)local_a8._4_4_ >> 1;
          }
          else {
            uVar12 = local_a8._4_4_ >> 1;
          }
        }
        else if (lVar15 < 0) {
          uVar12 = ~((int)~local_a8._4_4_ / iVar20);
        }
        else {
          uVar12 = (int)local_a8._4_4_ / iVar20;
        }
      }
LAB_004579a0:
      local_a8 = CONCAT44(uVar12,(uint)local_a8);
      if (iVar13 != 1) {
        if (iVar13 == 4) {
          if ((int)uStack_a0 < 0) {
            uStack_a0 = (int)uStack_a0 >> 2;
          }
          else {
            uStack_a0 = uStack_a0 >> 2;
          }
        }
        else if (iVar13 == 2) {
          if ((int)uStack_a0 < 0) {
            uStack_a0 = (int)uStack_a0 >> 1;
          }
          else {
            uStack_a0 = uStack_a0 >> 1;
          }
        }
        else if ((int)uStack_a0 < 0) {
          uStack_a0 = ~((int)~uStack_a0 / iVar13);
        }
        else {
          uStack_a0 = (int)uStack_a0 / iVar13;
        }
      }
      uStack_94._4_4_ = (uint)((ulong)lVar10 >> 0x20);
      uStack_94._0_4_ = (uint)lVar10;
      if (uStack_94._4_4_ == 0) {
        uVar12 = auStack_9c[0];
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            uVar12 = (int)auStack_9c[0] >> 2;
            if (-1 < lVar9) {
              uVar12 = auStack_9c[0] >> 2;
            }
          }
          else if (iVar17 == 2) {
            uVar12 = (int)auStack_9c[0] >> 1;
            if (-1 < lVar9) {
              uVar12 = auStack_9c[0] >> 1;
            }
          }
          else if (lVar9 < 0) {
            uVar12 = ~((int)~auStack_9c[0] / iVar17);
          }
          else {
            uVar12 = (int)auStack_9c[0] / iVar17;
          }
        }
        auStack_9c[0] = uVar12;
        uVar12 = auStack_9c[1];
        if (iVar20 != 1) {
          if (iVar20 == 4) {
            uVar12 = (int)auStack_9c[1] >> 2;
            if (-1 < lVar18) {
              uVar12 = auStack_9c[1] >> 2;
            }
          }
          else if (iVar20 == 2) {
            uVar12 = (int)auStack_9c[1] >> 1;
            if (-1 < lVar18) {
              uVar12 = auStack_9c[1] >> 1;
            }
          }
          else if (lVar18 < 0) {
            uVar12 = ~((int)~auStack_9c[1] / iVar20);
          }
          else {
            uVar12 = (int)auStack_9c[1] / iVar20;
          }
        }
        auStack_9c[1] = uVar12;
        uVar12 = (uint)uStack_94;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            uVar12 = (int)(uint)uStack_94 >> 2;
            if (-1 < (int)(uint)uStack_94) {
              uVar12 = (uint)uStack_94 >> 2;
            }
          }
          else if (iVar13 == 2) {
            uVar12 = (int)(uint)uStack_94 >> 1;
            if (-1 < (int)(uint)uStack_94) {
              uVar12 = (uint)uStack_94 >> 1;
            }
          }
          else if ((int)(uint)uStack_94 < 0) {
            uVar12 = ~((int)~(uint)uStack_94 / iVar13);
          }
          else {
            uVar12 = (int)(uint)uStack_94 / iVar13;
          }
        }
      }
      else {
        local_4c[0] = 0;
        local_4c[1] = 0;
        local_4c[2] = 0;
        lVar15 = 0;
        do {
          if (((uStack_94._4_4_ >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
             ((int)auStack_9c[lVar15] % local_40[lVar15] != 0)) {
            local_4c[lVar15] = 1;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        uVar12 = auStack_9c[0];
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            uVar12 = (int)auStack_9c[0] >> 2;
            if (-1 < lVar9) {
              uVar12 = auStack_9c[0] >> 2;
            }
          }
          else if (iVar17 == 2) {
            uVar12 = (int)auStack_9c[0] >> 1;
            if (-1 < lVar9) {
              uVar12 = auStack_9c[0] >> 1;
            }
          }
          else if (lVar9 < 0) {
            uVar12 = ~((int)~auStack_9c[0] / iVar17);
          }
          else {
            uVar12 = (int)auStack_9c[0] / iVar17;
          }
        }
        uVar14 = auStack_9c[1];
        if (iVar20 != 1) {
          if (iVar20 == 4) {
            uVar14 = (int)auStack_9c[1] >> 2;
            if (-1 < lVar18) {
              uVar14 = auStack_9c[1] >> 2;
            }
          }
          else if (iVar20 == 2) {
            uVar14 = (int)auStack_9c[1] >> 1;
            if (-1 < lVar18) {
              uVar14 = auStack_9c[1] >> 1;
            }
          }
          else if (lVar18 < 0) {
            uVar14 = ~((int)~auStack_9c[1] / iVar20);
          }
          else {
            uVar14 = (int)auStack_9c[1] / iVar20;
          }
        }
        uVar11 = (uint)uStack_94;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            uVar11 = (int)(uint)uStack_94 >> 2;
            if (-1 < (int)(uint)uStack_94) {
              uVar11 = (uint)uStack_94 >> 2;
            }
          }
          else if (iVar13 == 2) {
            uVar11 = (int)(uint)uStack_94 >> 1;
            if (-1 < (int)(uint)uStack_94) {
              uVar11 = (uint)uStack_94 >> 1;
            }
          }
          else if ((int)(uint)uStack_94 < 0) {
            uVar11 = ~((int)~(uint)uStack_94 / iVar13);
          }
          else {
            uVar11 = (int)(uint)uStack_94 / iVar13;
          }
        }
        auStack_9c[0] = uVar12 + local_4c[0];
        auStack_9c[1] = uVar14 + local_4c[1];
        uVar12 = uVar11 + local_4c[2];
      }
      uStack_94 = CONCAT44(uStack_94._4_4_,uVar12);
    }
    local_78.bigend.vect[1] = auStack_9c[1];
    local_78.bigend.vect[2] = (uint)uStack_94;
    local_78.smallend.vect[0] = (uint)local_a8;
    local_78.smallend.vect[1] = local_a8._4_4_;
    local_78.smallend.vect[2] = uStack_a0;
    local_78.bigend.vect[0] = auStack_9c[0];
    lVar18 = 0;
    local_78.btype.itype = uStack_94._4_4_;
    do {
      uVar14 = 1 << ((byte)lVar18 & 0x1f);
      uVar12 = (uint)lVar18;
      local_78.bigend.vect[lVar18] =
           (local_78.bigend.vect[lVar18] + (uint)((uVar16 >> (uVar12 & 0x1f) & 1) != 0)) -
           (uint)((local_78.btype.itype >> (uVar12 & 0x1f) & 1) != 0);
      if ((uVar16 >> (uVar12 & 0x1f) & 1) == 0) {
        local_78.btype.itype = ~uVar14 & local_78.btype.itype;
      }
      else {
        local_78.btype.itype = uVar14 | local_78.btype.itype;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    iVar5._M_current =
         (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)__return_storage_ptr__,iVar5,
                 &local_78);
    }
    else {
      *(ulong *)((iVar5._M_current)->bigend).vect =
           CONCAT44(local_78.bigend.vect[1],local_78.bigend.vect[0]);
      *(ulong *)(((iVar5._M_current)->bigend).vect + 2) =
           CONCAT44(local_78.btype.itype,local_78.bigend.vect[2]);
      *(long *)((iVar5._M_current)->smallend).vect = local_a8;
      *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
           CONCAT44(local_78.bigend.vect[0],uStack_a0);
      ppBVar1 = &(__return_storage_ptr__->m_lbox).
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    uVar19 = uVar19 + 1;
    if (uVar19 == local_58) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

BoxList
BoxArray::boxList () const
{
    const int N = size();
    BoxList newb;
    newb.data().reserve(N);
    if (N > 0) {
        newb.set(ixType());
        auto const& bxs = this->m_ref->m_abox;
        if (m_bat.is_null()) {
            for (int i = 0; i < N; ++i) {
                newb.push_back(bxs[i]);
            }
        } else if (m_bat.is_simple()) {
            IndexType t = ixType();
            IntVect cr = crseRatio();
            for (int i = 0; i < N; ++i) {
                newb.push_back(amrex::convert(amrex::coarsen(bxs[i],cr),t));
            }
        } else {
            for (int i = 0; i < N; ++i) {
                newb.push_back(m_bat.m_op.m_bndryReg(bxs[i]));
            }
        }
    }
    return newb;
}